

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode UA_Client_Subscriptions_remove(UA_Client *client,UA_UInt32 subscriptionId)

{
  UA_UInt32 *pUVar1;
  uint uVar2;
  UA_Client_MonitoredItem *pUVar3;
  UA_Logger logger;
  UA_StatusCode UVar4;
  UA_Client_MonitoredItem *pUVar5;
  char *pcVar6;
  UA_Client_Subscription *sub;
  UA_Client *client_00;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  UA_UInt32 *local_e0;
  undefined1 local_d8 [8];
  UA_DeleteSubscriptionsResponse response;
  
  sub = (UA_Client_Subscription *)&client->subscriptions;
  do {
    sub = (sub->listEntry).le_next;
    if (sub == (UA_Client_Subscription *)0x0) {
      return 0x80280000;
    }
  } while (sub->subscriptionID != subscriptionId);
  pUVar1 = &sub->subscriptionID;
  pUVar5 = (sub->monitoredItems).lh_first;
  while (pUVar5 != (UA_Client_MonitoredItem *)0x0) {
    pUVar3 = (pUVar5->listEntry).le_next;
    UVar4 = UA_Client_Subscriptions_removeMonitoredItem(client,*pUVar1,pUVar5->monitoredItemId);
    pUVar5 = pUVar3;
    if (UVar4 != 0) {
      return UVar4;
    }
  }
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_e8 = 1;
  local_e0 = pUVar1;
  __UA_Client_Service(client,&local_158,UA_TYPES + 0x48,local_d8,UA_TYPES + 0x7b);
  UVar4 = response.responseHeader.timestamp._4_4_;
  if ((response.responseHeader.timestamp._4_4_ == 0) &&
     (response.responseHeader.additionalHeader.content.encoded.body.data != (UA_Byte *)0x0)) {
    UVar4 = *(UA_StatusCode *)response.resultsSize;
  }
  client_00 = (UA_Client *)local_d8;
  UA_deleteMembers(client_00,UA_TYPES + 0x7b);
  if ((UVar4 != 0x80280000) && (UVar4 != 0)) {
    logger = (client->config).logger;
    uVar2 = *pUVar1;
    pcVar6 = UA_StatusCode_name(UVar4);
    UA_LOG_INFO(logger,UA_LOGCATEGORY_CLIENT,"Could not remove subscription %u with error code %s",
                (ulong)uVar2,pcVar6);
    return UVar4;
  }
  UA_Client_Subscriptions_forceDelete(client_00,sub);
  return 0;
}

Assistant:

UA_StatusCode
UA_Client_Subscriptions_remove(UA_Client *client, UA_UInt32 subscriptionId) {
    UA_Client_Subscription *sub;
    LIST_FOREACH(sub, &client->subscriptions, listEntry) {
        if(sub->subscriptionID == subscriptionId)
            break;
    }
    if(!sub)
        return UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;

    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_Client_MonitoredItem *mon, *tmpmon;
    LIST_FOREACH_SAFE(mon, &sub->monitoredItems, listEntry, tmpmon) {
        retval =
            UA_Client_Subscriptions_removeMonitoredItem(client, sub->subscriptionID,
                                                        mon->monitoredItemId);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
    }

    /* remove the subscription remotely */
    UA_DeleteSubscriptionsRequest request;
    UA_DeleteSubscriptionsRequest_init(&request);
    request.subscriptionIdsSize = 1;
    request.subscriptionIds = &sub->subscriptionID;
    UA_DeleteSubscriptionsResponse response = UA_Client_Service_deleteSubscriptions(client, request);
    retval = response.responseHeader.serviceResult;
    if(retval == UA_STATUSCODE_GOOD && response.resultsSize > 0)
        retval = response.results[0];
    UA_DeleteSubscriptionsResponse_deleteMembers(&response);

    if(retval != UA_STATUSCODE_GOOD && retval != UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID) {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_CLIENT,
                    "Could not remove subscription %u with error code %s",
                    sub->subscriptionID, UA_StatusCode_name(retval));
        return retval;
    }

    UA_Client_Subscriptions_forceDelete(client, sub);
    return UA_STATUSCODE_GOOD;
}